

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yprp_grouping(lys_ypr_ctx_conflict *pctx,lysp_node_grp *grp)

{
  ulong local_58;
  lysp_node_grp *local_48;
  lysp_node_grp *subgrp;
  lysp_node_notif *notif;
  lysp_node_action *action;
  lysp_node *data;
  ulong uStack_20;
  int8_t flag;
  uint64_t u;
  lysp_node_grp *grp_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  data._7_1_ = '\0';
  u = (uint64_t)grp;
  grp_local = (lysp_node_grp *)pctx;
  ypr_open(pctx,"grouping","name",(grp->field_0).node.name,'\0');
  (grp_local->field_0).node.nodetype = (grp_local->field_0).node.nodetype + 1;
  yprp_extension_instances
            ((lys_ypr_ctx_conflict *)grp_local,LY_STMT_GROUPING,'\0',
             *(lysp_ext_instance **)(u + 0x38),(int8_t *)((long)&data + 7));
  ypr_status((lys_ypr_ctx_conflict *)grp_local,*(uint16_t *)(u + 10),*(void **)(u + 0x38),
             (int8_t *)((long)&data + 7));
  ypr_description((lys_ypr_ctx_conflict *)grp_local,*(char **)(u + 0x20),*(void **)(u + 0x38),
                  (int8_t *)((long)&data + 7));
  ypr_reference((lys_ypr_ctx_conflict *)grp_local,*(char **)(u + 0x28),*(void **)(u + 0x38),
                (int8_t *)((long)&data + 7));
  uStack_20 = 0;
  while( true ) {
    if (*(long *)(u + 0x40) == 0) {
      local_58 = 0;
    }
    else {
      local_58 = *(ulong *)(*(long *)(u + 0x40) + -8);
    }
    if (local_58 <= uStack_20) break;
    ypr_close_parent((lys_ypr_ctx_conflict *)grp_local,(int8_t *)((long)&data + 7));
    yprp_typedef((lys_ypr_ctx_conflict *)grp_local,
                 (lysp_tpdf *)(*(long *)(u + 0x40) + uStack_20 * 0xb0));
    uStack_20 = uStack_20 + 1;
  }
  for (local_48 = *(lysp_node_grp **)(u + 0x48); local_48 != (lysp_node_grp *)0x0;
      local_48 = (local_48->field_0).field_1.next) {
    ypr_close_parent((lys_ypr_ctx_conflict *)grp_local,(int8_t *)((long)&data + 7));
    yprp_grouping((lys_ypr_ctx_conflict *)grp_local,local_48);
  }
  for (action = *(lysp_node_action **)(u + 0x50); action != (lysp_node_action *)0x0;
      action = (action->field_0).field_1.next) {
    ypr_close_parent((lys_ypr_ctx_conflict *)grp_local,(int8_t *)((long)&data + 7));
    yprp_node((lys_ypr_ctx_conflict *)grp_local,(lysp_node *)action);
  }
  for (notif = *(lysp_node_notif **)(u + 0x58); notif != (lysp_node_notif *)0x0;
      notif = (notif->field_0).field_1.next) {
    ypr_close_parent((lys_ypr_ctx_conflict *)grp_local,(int8_t *)((long)&data + 7));
    yprp_action((lys_ypr_ctx_conflict *)grp_local,(lysp_node_action *)notif);
  }
  for (subgrp = *(lysp_node_grp **)(u + 0x60); subgrp != (lysp_node_grp *)0x0;
      subgrp = (subgrp->field_0).field_1.next) {
    ypr_close_parent((lys_ypr_ctx_conflict *)grp_local,(int8_t *)((long)&data + 7));
    yprp_notification((lys_ypr_ctx_conflict *)grp_local,(lysp_node_notif *)subgrp);
  }
  (grp_local->field_0).node.nodetype = (grp_local->field_0).node.nodetype - 1;
  ypr_close((lys_ypr_ctx_conflict *)grp_local,"grouping",data._7_1_);
  return;
}

Assistant:

static void
yprp_grouping(struct lys_ypr_ctx *pctx, const struct lysp_node_grp *grp)
{
    LY_ARRAY_COUNT_TYPE u;
    ly_bool flag = 0;
    struct lysp_node *data;
    struct lysp_node_action *action;
    struct lysp_node_notif *notif;
    struct lysp_node_grp *subgrp;

    ly_print_(pctx->out, "%*sgrouping %s", INDENT, grp->name);
    LEVEL++;

    yprp_extension_instances(pctx, LY_STMT_GROUPING, 0, grp->exts, &flag);
    ypr_status(pctx, grp->flags, grp->exts, &flag);
    ypr_description(pctx, grp->dsc, grp->exts, &flag);
    ypr_reference(pctx, grp->ref, grp->exts, &flag);

    LY_ARRAY_FOR(grp->typedefs, u) {
        ypr_open(pctx->out, &flag);
        yprp_typedef(pctx, &grp->typedefs[u]);
    }

    LY_LIST_FOR(grp->groupings, subgrp) {
        ypr_open(pctx->out, &flag);
        yprp_grouping(pctx, subgrp);
    }

    LY_LIST_FOR(grp->child, data) {
        ypr_open(pctx->out, &flag);
        yprp_node(pctx, data);
    }

    LY_LIST_FOR(grp->actions, action) {
        ypr_open(pctx->out, &flag);
        yprp_action(pctx, action);
    }

    LY_LIST_FOR(grp->notifs, notif) {
        ypr_open(pctx->out, &flag);
        yprp_notification(pctx, notif);
    }

    LEVEL--;
    ypr_close(pctx, flag);
}